

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O3

aiMeshMorphAnim * CreateMeshMorphAnim(Asset *r,Node *node,AnimationSamplers *samplers)

{
  undefined8 *puVar1;
  Sampler *pSVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float *pfVar5;
  aiMeshMorphAnim *paVar6;
  ulong *puVar7;
  void *pvVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  aiMeshMorphKey *paVar16;
  float *values;
  float *times;
  float *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  float *local_50;
  ulong local_48;
  long local_40 [2];
  
  paVar6 = (aiMeshMorphAnim *)operator_new(0x410);
  (paVar6->mName).length = 0;
  (paVar6->mName).data[0] = '\0';
  memset((paVar6->mName).data + 1,0x1b,0x3ff);
  paVar6->mNumKeys = 0;
  paVar6->mKeys = (aiMeshMorphKey *)0x0;
  uVar11 = (ulong)((node->super_Object).name._M_string_length != 0);
  lVar10 = *(long *)((node->matrix).value + uVar11 * 8 + -0x1c);
  local_50 = (float *)local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,lVar10,
             *(long *)((node->matrix).value + uVar11 * 8 + -0x1a) + lVar10);
  pfVar5 = local_50;
  if (local_48 < 0x400) {
    (paVar6->mName).length = (ai_uint32)local_48;
    memcpy((paVar6->mName).data,local_50,local_48);
    (paVar6->mName).data[local_48] = '\0';
  }
  if (pfVar5 != (float *)local_40) {
    operator_delete(pfVar5,local_40[0] + 1);
  }
  pSVar2 = samplers->weight;
  if (pSVar2 != (Sampler *)0x0) {
    lVar10 = 0;
    local_50 = (float *)0x0;
    glTF2::Accessor::ExtractData<float>
              ((((pSVar2->input).vector)->
               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
               super__Vector_impl_data._M_start[(pSVar2->input).index],&local_50);
    local_70 = (float *)0x0;
    glTF2::Accessor::ExtractData<float>
              ((((samplers->weight->output).vector)->
               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
               super__Vector_impl_data._M_start[(samplers->weight->output).index],&local_70);
    pSVar2 = samplers->weight;
    uVar11 = (((pSVar2->input).vector)->
             super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
             super__Vector_impl_data._M_start[(pSVar2->input).index]->count;
    uVar12 = (uint)uVar11;
    uVar11 = uVar11 & 0xffffffff;
    paVar6->mNumKeys = uVar12;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar11;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (((pSVar2->output).vector)->
                   super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>).
                   _M_impl.super__Vector_impl_data._M_start[(pSVar2->output).index]->count;
    puVar7 = (ulong *)operator_new__(uVar11 * 0x20 + 8);
    *puVar7 = uVar11;
    paVar16 = (aiMeshMorphKey *)(puVar7 + 1);
    do {
      puVar1 = (undefined8 *)((long)puVar7 + lVar10 + 0x14);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&paVar16->mTime + lVar10);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar10 = lVar10 + 0x20;
    } while (uVar11 * 0x20 != lVar10);
    paVar6->mKeys = paVar16;
    local_58 = uVar11;
    if (uVar12 != 0) {
      iVar15 = SUB164(auVar4 / auVar3,0);
      uVar11 = SUB168(auVar4 / auVar3,0) & 0xffffffff;
      local_60 = uVar11 * 4;
      local_68 = uVar11 * 8;
      uVar14 = 0;
      iVar13 = 0;
      do {
        paVar16[uVar14].mTime = (double)(local_50[uVar14] * 1000.0);
        *(int *)(puVar7 + uVar14 * 4 + 4) = iVar15;
        pvVar8 = operator_new__(local_60);
        puVar7[uVar14 * 4 + 2] = (ulong)pvVar8;
        pvVar8 = operator_new__(local_68);
        puVar7[uVar14 * 4 + 3] = (ulong)pvVar8;
        if (iVar15 != 0) {
          uVar9 = 0;
          do {
            paVar16[uVar14].mValues[uVar9] = (uint)uVar9;
            paVar16[uVar14].mWeights[uVar9] =
                 (double)(float)(~-(uint)(local_70[iVar13 + (uint)uVar9] <= 0.0) &
                                (uint)local_70[iVar13 + (uint)uVar9]);
            uVar9 = uVar9 + 1;
          } while (uVar9 < uVar11);
          iVar13 = iVar13 + (int)uVar9;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != local_58);
    }
    if (local_50 != (float *)0x0) {
      operator_delete__(local_50);
    }
    if (local_70 != (float *)0x0) {
      operator_delete__(local_70);
    }
  }
  return paVar6;
}

Assistant:

aiMeshMorphAnim* CreateMeshMorphAnim(glTF2::Asset& r, Node& node, AnimationSamplers& samplers)
{
    aiMeshMorphAnim* anim = new aiMeshMorphAnim();
    anim->mName = GetNodeName(node);

    static const float kMillisecondsFromSeconds = 1000.f;

    if (nullptr != samplers.weight) {
        float* times = nullptr;
        samplers.weight->input->ExtractData(times);
        float* values = nullptr;
        samplers.weight->output->ExtractData(values);
        anim->mNumKeys = static_cast<uint32_t>(samplers.weight->input->count);

        const unsigned int numMorphs = samplers.weight->output->count / anim->mNumKeys;

        anim->mKeys = new aiMeshMorphKey[anim->mNumKeys];
        unsigned int k = 0u;
        for (unsigned int i = 0u; i < anim->mNumKeys; ++i) {
            anim->mKeys[i].mTime = times[i] * kMillisecondsFromSeconds;
            anim->mKeys[i].mNumValuesAndWeights = numMorphs;
            anim->mKeys[i].mValues = new unsigned int[numMorphs];
            anim->mKeys[i].mWeights = new double[numMorphs];

            for (unsigned int j = 0u; j < numMorphs; ++j, ++k) {
                anim->mKeys[i].mValues[j] = j;
                anim->mKeys[i].mWeights[j] = ( 0.f > values[k] ) ? 0.f : values[k];
            }
        }

        delete[] times;
        delete[] values;
    }

    return anim;
}